

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct32_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  int iVar7;
  int iVar8;
  __m256i *rounding_00;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  __m256i cospi32;
  __m256i clamp_hi;
  __m256i cospim16;
  __m256i cospi16;
  __m256i cospim48;
  __m256i cospi48;
  __m256i cospim32;
  __m256i clamp_lo;
  __m256i rounding;
  __m256i cospim40;
  __m256i cospi40;
  __m256i cospi24;
  __m256i cospim24;
  __m256i cospim56;
  __m256i cospim8;
  __m256i cospi8;
  __m256i cospi56;
  int bit_00;
  int local_6e0;
  int iStack_6dc;
  int iStack_6d8;
  int iStack_6d4;
  int iStack_6d0;
  int iStack_6cc;
  int iStack_6c8;
  int iStack_6c4;
  __m256i *local_6c0;
  int iStack_6b8;
  int iStack_6b4;
  int iStack_6b0;
  int iStack_6ac;
  int iStack_6a8;
  int iStack_6a4;
  undefined1 local_690 [16];
  int local_680;
  int iStack_67c;
  int iStack_678;
  int iStack_674;
  int iStack_670;
  int iStack_66c;
  int iStack_668;
  int iStack_664;
  int local_660;
  int iStack_65c;
  int iStack_658;
  int iStack_654;
  int iStack_650;
  int iStack_64c;
  int iStack_648;
  int iStack_644;
  int local_640;
  int iStack_63c;
  int iStack_638;
  int iStack_634;
  int iStack_630;
  int iStack_62c;
  int iStack_628;
  int iStack_624;
  int local_620;
  int iStack_61c;
  int iStack_618;
  int iStack_614;
  int iStack_610;
  int iStack_60c;
  int iStack_608;
  int iStack_604;
  int local_600;
  int iStack_5fc;
  int iStack_5f8;
  int iStack_5f4;
  int iStack_5f0;
  int iStack_5ec;
  int iStack_5e8;
  int iStack_5e4;
  int local_5e0;
  int iStack_5dc;
  int iStack_5d8;
  int iStack_5d4;
  int iStack_5d0;
  int iStack_5cc;
  int iStack_5c8;
  int iStack_5c4;
  __m256i local_5c0;
  int local_5a0;
  int iStack_59c;
  int iStack_598;
  int iStack_594;
  int iStack_590;
  int iStack_58c;
  int iStack_588;
  int iStack_584;
  __m256i local_580;
  int local_560;
  int iStack_55c;
  int iStack_558;
  int iStack_554;
  int iStack_550;
  int iStack_54c;
  int iStack_548;
  int iStack_544;
  int local_540;
  int iStack_53c;
  int iStack_538;
  int iStack_534;
  int iStack_530;
  int iStack_52c;
  int iStack_528;
  int iStack_524;
  int local_520;
  int iStack_51c;
  int iStack_518;
  int iStack_514;
  int iStack_510;
  int iStack_50c;
  int iStack_508;
  int iStack_504;
  int local_500;
  int iStack_4fc;
  int iStack_4f8;
  int iStack_4f4;
  int iStack_4f0;
  int iStack_4ec;
  int iStack_4e8;
  int iStack_4e4;
  int local_4e0;
  int iStack_4dc;
  int iStack_4d8;
  int iStack_4d4;
  int iStack_4d0;
  int iStack_4cc;
  int iStack_4c8;
  int iStack_4c4;
  int local_4c0;
  int iStack_4bc;
  int iStack_4b8;
  int iStack_4b4;
  int iStack_4b0;
  int iStack_4ac;
  int iStack_4a8;
  int iStack_4a4;
  int local_4a0;
  int iStack_49c;
  int iStack_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  int iStack_488;
  int iStack_484;
  int local_480;
  int iStack_47c;
  int iStack_478;
  int iStack_474;
  int iStack_470;
  int iStack_46c;
  int iStack_468;
  int iStack_464;
  __m256i local_460;
  __m256i local_440;
  longlong local_420;
  longlong lStack_418;
  longlong lStack_410;
  longlong lStack_408;
  longlong local_400;
  longlong lStack_3f8;
  longlong lStack_3f0;
  longlong lStack_3e8;
  undefined1 local_3e0 [32];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  rounding_00 = (__m256i *)(long)bit;
  uVar1 = *(undefined4 *)(&DAT_00b99618 + (long)rounding_00 * 0x100);
  auVar18._4_4_ = uVar1;
  auVar18._0_4_ = uVar1;
  auVar18._8_4_ = uVar1;
  auVar18._12_4_ = uVar1;
  auVar18._16_4_ = uVar1;
  auVar18._20_4_ = uVar1;
  auVar18._24_4_ = uVar1;
  auVar18._28_4_ = uVar1;
  iVar9 = LoadMaskz2[(long)rounding_00 * 8 + 3][6];
  auVar17._4_4_ = iVar9;
  auVar17._0_4_ = iVar9;
  auVar17._8_4_ = iVar9;
  auVar17._12_4_ = iVar9;
  auVar17._16_4_ = iVar9;
  auVar17._20_4_ = iVar9;
  auVar17._24_4_ = iVar9;
  auVar17._28_4_ = iVar9;
  uVar1 = *(undefined4 *)(&DAT_00b995f8 + (long)rounding_00 * 0x20);
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  auVar14._16_4_ = uVar1;
  auVar14._20_4_ = uVar1;
  auVar14._24_4_ = uVar1;
  auVar14._28_4_ = uVar1;
  iVar9 = LoadMaskz2[(long)rounding_00 * 8 + 2][6];
  auVar12._4_4_ = iVar9;
  auVar12._0_4_ = iVar9;
  auVar12._8_4_ = iVar9;
  auVar12._12_4_ = iVar9;
  auVar12._16_4_ = iVar9;
  auVar12._20_4_ = iVar9;
  auVar12._24_4_ = iVar9;
  auVar12._28_4_ = iVar9;
  iVar9 = LoadMaskz2[(long)rounding_00 * 8 + 3][2];
  auVar15._4_4_ = iVar9;
  auVar15._0_4_ = iVar9;
  auVar15._8_4_ = iVar9;
  auVar15._12_4_ = iVar9;
  auVar15._16_4_ = iVar9;
  auVar15._20_4_ = iVar9;
  auVar15._24_4_ = iVar9;
  auVar15._28_4_ = iVar9;
  iVar9 = LoadMaskz2[(long)rounding_00 * 8 + 2][2];
  auVar19._4_4_ = iVar9;
  auVar19._0_4_ = iVar9;
  auVar19._8_4_ = iVar9;
  auVar19._12_4_ = iVar9;
  auVar19._16_4_ = iVar9;
  auVar19._20_4_ = iVar9;
  auVar19._24_4_ = iVar9;
  auVar19._28_4_ = iVar9;
  iVar6 = -*(int *)(&DAT_00b99608 + (long)rounding_00 * 0x20);
  iVar7 = -*(int *)(&DAT_00b995e8 + (long)rounding_00 * 0x20);
  uVar1 = *(undefined4 *)(&DAT_00b99610 + (long)rounding_00 * 0x100);
  auVar13._4_4_ = uVar1;
  auVar13._0_4_ = uVar1;
  auVar13._8_4_ = uVar1;
  auVar13._12_4_ = uVar1;
  auVar13._16_4_ = uVar1;
  auVar13._20_4_ = uVar1;
  auVar13._24_4_ = uVar1;
  auVar13._28_4_ = uVar1;
  iStack_6b8 = LoadMaskz2[(long)rounding_00 * 8 + 3][4];
  iVar8 = -*(int *)(&DAT_00b995f0 + (long)rounding_00 * 0x20);
  local_480 = *(int *)(&DAT_00b99600 + (long)rounding_00 * 0x20);
  local_520 = LoadMaskz2[(long)rounding_00 * 8 + 5][0];
  local_540 = LoadMaskz2[(long)rounding_00 * 8 + 7][0];
  local_560 = -local_540;
  local_4a0 = LoadMaskz2[(long)rounding_00 * 8 + 3][0];
  local_4c0 = -local_4a0;
  local_4e0 = -local_480;
  local_500 = -local_520;
  local_6e0 = LoadMaskz2[(long)rounding_00 * 8 + 6][0];
  local_5e0 = -local_6e0;
  iVar9 = LoadMaskz2[(long)rounding_00 * 8 + 2][4];
  auVar20._4_4_ = iVar9;
  auVar20._0_4_ = iVar9;
  auVar20._8_4_ = iVar9;
  auVar20._12_4_ = iVar9;
  auVar20._16_4_ = iVar9;
  auVar20._20_4_ = iVar9;
  auVar20._24_4_ = iVar9;
  auVar20._28_4_ = iVar9;
  local_640 = LoadMaskz2[(long)rounding_00 * 8 + 4][0];
  local_600 = *(int *)(&DAT_00b995e0 + (long)rounding_00 * 0x20);
  local_620 = -local_600;
  local_660 = -local_640;
  bit_00 = 1;
  iVar9 = 1 << ((char)bit - 1U & 0x1f);
  iVar10 = bd + (uint)(do_cols == 0) * 2;
  local_680 = 0x8000;
  if (0xf < iVar10 + 6) {
    local_680 = 1 << ((char)iVar10 + 5U & 0x1f);
  }
  local_5a0 = -local_680;
  local_680 = local_680 + -1;
  auVar22._4_4_ = iVar7;
  auVar22._0_4_ = iVar7;
  auVar22._8_4_ = iVar7;
  auVar22._12_4_ = iVar7;
  auVar22._16_4_ = iVar7;
  auVar22._20_4_ = iVar7;
  auVar22._24_4_ = iVar7;
  auVar22._28_4_ = iVar7;
  local_5c0[0]._4_4_ = iVar9;
  local_5c0[0]._0_4_ = iVar9;
  local_5c0[1]._0_4_ = iVar9;
  local_5c0[1]._4_4_ = iVar9;
  local_5c0[2]._0_4_ = iVar9;
  local_5c0[2]._4_4_ = iVar9;
  local_5c0[3]._0_4_ = iVar9;
  local_5c0[3]._4_4_ = iVar9;
  local_460 = *in;
  auVar19 = vpmulld_avx2(auVar19,(undefined1  [32])in[1]);
  auVar18 = vpmulld_avx2(auVar18,(undefined1  [32])in[1]);
  auVar2 = vpmulld_avx2(auVar22,(undefined1  [32])in[7]);
  auVar17 = vpmulld_avx2(auVar17,(undefined1  [32])in[7]);
  auVar15 = vpmulld_avx2(auVar15,(undefined1  [32])in[5]);
  auVar14 = vpmulld_avx2(auVar14,(undefined1  [32])in[5]);
  auVar16._4_4_ = iVar6;
  auVar16._0_4_ = iVar6;
  auVar16._8_4_ = iVar6;
  auVar16._12_4_ = iVar6;
  auVar16._16_4_ = iVar6;
  auVar16._20_4_ = iVar6;
  auVar16._24_4_ = iVar6;
  auVar16._28_4_ = iVar6;
  auVar3 = vpmulld_avx2(auVar16,(undefined1  [32])in[3]);
  auVar4 = vpmulld_avx2(auVar12,(undefined1  [32])in[3]);
  auVar20 = vpmulld_avx2(auVar20,(undefined1  [32])in[2]);
  auVar13 = vpmulld_avx2(auVar13,(undefined1  [32])in[2]);
  auVar11._4_4_ = iVar8;
  auVar11._0_4_ = iVar8;
  auVar11._8_4_ = iVar8;
  auVar11._12_4_ = iVar8;
  auVar11._16_4_ = iVar8;
  auVar11._20_4_ = iVar8;
  auVar11._24_4_ = iVar8;
  auVar11._28_4_ = iVar8;
  auVar12 = vpaddd_avx2(auVar19,(undefined1  [32])local_5c0);
  auVar19 = vpmulld_avx2(auVar11,(undefined1  [32])in[6]);
  auVar5._4_4_ = iStack_6b8;
  auVar5._0_4_ = iStack_6b8;
  auVar5._8_4_ = iStack_6b8;
  auVar5._12_4_ = iStack_6b8;
  auVar5._16_4_ = iStack_6b8;
  auVar5._20_4_ = iStack_6b8;
  auVar5._24_4_ = iStack_6b8;
  auVar5._28_4_ = iStack_6b8;
  auVar5 = vpmulld_avx2((undefined1  [32])in[6],auVar5);
  local_a0 = vpsrad_avx2(auVar12,ZEXT416((uint)bit));
  auVar12 = vpaddd_avx2(auVar18,(undefined1  [32])local_5c0);
  local_260 = vpsrad_avx2(auVar12,ZEXT416((uint)bit));
  auVar12 = vpaddd_avx2(auVar2,(undefined1  [32])local_5c0);
  auVar21 = ZEXT416((uint)bit);
  local_220 = vpsrad_avx2(auVar12,auVar21);
  auVar12 = vpaddd_avx2((undefined1  [32])local_5c0,auVar17);
  local_e0 = vpsrad_avx2(auVar12,auVar21);
  auVar12 = vpaddd_avx2((undefined1  [32])local_5c0,auVar15);
  local_120 = vpsrad_avx2(auVar12,auVar21);
  auVar12 = vpaddd_avx2((undefined1  [32])local_5c0,auVar14);
  local_1e0 = vpsrad_avx2(auVar12,auVar21);
  auVar12 = vpaddd_avx2((undefined1  [32])local_5c0,auVar3);
  local_690 = ZEXT416((uint)bit);
  local_1a0 = vpsrad_avx2(auVar12,local_690);
  auVar12 = vpaddd_avx2((undefined1  [32])local_5c0,auVar4);
  local_160 = vpsrad_avx2(auVar12,local_690);
  auVar12 = vpaddd_avx2(auVar20,(undefined1  [32])local_5c0);
  local_2a0 = vpsrad_avx2(auVar12,local_690);
  auVar12 = vpaddd_avx2((undefined1  [32])local_5c0,auVar13);
  local_360 = vpsrad_avx2(auVar12,local_690);
  auVar12 = vpaddd_avx2((undefined1  [32])local_5c0,auVar19);
  local_320 = vpsrad_avx2(auVar12,local_690);
  auVar12 = vpaddd_avx2(auVar5,(undefined1  [32])local_5c0);
  local_2e0 = vpsrad_avx2(auVar12,local_690);
  auVar3._4_4_ = local_4a0;
  auVar3._0_4_ = local_4a0;
  auVar3._8_4_ = local_4a0;
  auVar3._12_4_ = local_4a0;
  auVar3._16_4_ = local_4a0;
  auVar3._20_4_ = local_4a0;
  auVar3._24_4_ = local_4a0;
  auVar3._28_4_ = local_4a0;
  auVar12 = vpmulld_avx2((undefined1  [32])in[4],auVar3);
  auVar12 = vpaddd_avx2((undefined1  [32])local_5c0,auVar12);
  local_380 = vpsrad_avx2(auVar12,local_690);
  auVar4._4_4_ = local_480;
  auVar4._0_4_ = local_480;
  auVar4._8_4_ = local_480;
  auVar4._12_4_ = local_480;
  auVar4._16_4_ = local_480;
  auVar4._20_4_ = local_480;
  auVar4._24_4_ = local_480;
  auVar4._28_4_ = local_480;
  auVar12 = vpmulld_avx2((undefined1  [32])in[4],auVar4);
  auVar12 = vpaddd_avx2((undefined1  [32])local_5c0,auVar12);
  local_3e0 = vpsrad_avx2(auVar12,ZEXT416((uint)bit));
  iStack_6dc = local_6e0;
  iStack_6d8 = local_6e0;
  iStack_6d4 = local_6e0;
  iStack_6d0 = local_6e0;
  iStack_6cc = local_6e0;
  iStack_6c8 = local_6e0;
  iStack_6c4 = local_6e0;
  iStack_6b4 = iStack_6b8;
  iStack_6b0 = iStack_6b8;
  iStack_6ac = iStack_6b8;
  iStack_6a8 = iStack_6b8;
  iStack_6a4 = iStack_6b8;
  iStack_67c = local_680;
  iStack_678 = local_680;
  iStack_674 = local_680;
  iStack_670 = local_680;
  iStack_66c = local_680;
  iStack_668 = local_680;
  iStack_664 = local_680;
  iStack_65c = local_660;
  iStack_658 = local_660;
  iStack_654 = local_660;
  iStack_650 = local_660;
  iStack_64c = local_660;
  iStack_648 = local_660;
  iStack_644 = local_660;
  iStack_63c = local_640;
  iStack_638 = local_640;
  iStack_634 = local_640;
  iStack_630 = local_640;
  iStack_62c = local_640;
  iStack_628 = local_640;
  iStack_624 = local_640;
  iStack_61c = local_620;
  iStack_618 = local_620;
  iStack_614 = local_620;
  iStack_610 = local_620;
  iStack_60c = local_620;
  iStack_608 = local_620;
  iStack_604 = local_620;
  iStack_5fc = local_600;
  iStack_5f8 = local_600;
  iStack_5f4 = local_600;
  iStack_5f0 = local_600;
  iStack_5ec = local_600;
  iStack_5e8 = local_600;
  iStack_5e4 = local_600;
  iStack_5dc = local_5e0;
  iStack_5d8 = local_5e0;
  iStack_5d4 = local_5e0;
  iStack_5d0 = local_5e0;
  iStack_5cc = local_5e0;
  iStack_5c8 = local_5e0;
  iStack_5c4 = local_5e0;
  iStack_59c = local_5a0;
  iStack_598 = local_5a0;
  iStack_594 = local_5a0;
  iStack_590 = local_5a0;
  iStack_58c = local_5a0;
  iStack_588 = local_5a0;
  iStack_584 = local_5a0;
  local_580 = local_5c0;
  iStack_55c = local_560;
  iStack_558 = local_560;
  iStack_554 = local_560;
  iStack_550 = local_560;
  iStack_54c = local_560;
  iStack_548 = local_560;
  iStack_544 = local_560;
  iStack_53c = local_540;
  iStack_538 = local_540;
  iStack_534 = local_540;
  iStack_530 = local_540;
  iStack_52c = local_540;
  iStack_528 = local_540;
  iStack_524 = local_540;
  iStack_51c = local_520;
  iStack_518 = local_520;
  iStack_514 = local_520;
  iStack_510 = local_520;
  iStack_50c = local_520;
  iStack_508 = local_520;
  iStack_504 = local_520;
  iStack_4fc = local_500;
  iStack_4f8 = local_500;
  iStack_4f4 = local_500;
  iStack_4f0 = local_500;
  iStack_4ec = local_500;
  iStack_4e8 = local_500;
  iStack_4e4 = local_500;
  iStack_4dc = local_4e0;
  iStack_4d8 = local_4e0;
  iStack_4d4 = local_4e0;
  iStack_4d0 = local_4e0;
  iStack_4cc = local_4e0;
  iStack_4c8 = local_4e0;
  iStack_4c4 = local_4e0;
  iStack_4bc = local_4c0;
  iStack_4b8 = local_4c0;
  iStack_4b4 = local_4c0;
  iStack_4b0 = local_4c0;
  iStack_4ac = local_4c0;
  iStack_4a8 = local_4c0;
  iStack_4a4 = local_4c0;
  iStack_49c = local_4a0;
  iStack_498 = local_4a0;
  iStack_494 = local_4a0;
  iStack_490 = local_4a0;
  iStack_48c = local_4a0;
  iStack_488 = local_4a0;
  iStack_484 = local_4a0;
  iStack_47c = local_480;
  iStack_478 = local_480;
  iStack_474 = local_480;
  iStack_470 = local_480;
  iStack_46c = local_480;
  iStack_468 = local_480;
  iStack_464 = local_480;
  local_340 = local_360;
  local_300 = local_320;
  local_2c0 = local_2e0;
  local_280 = local_2a0;
  local_240 = local_260;
  local_200 = local_220;
  local_1c0 = local_1e0;
  local_180 = local_1a0;
  local_140 = local_160;
  local_100 = local_120;
  local_c0 = local_e0;
  local_80 = local_a0;
  local_6c0 = out;
  idct32_stage4_avx2(&local_460,(__m256i *)&local_4c0,(__m256i *)&local_480,(__m256i *)&local_4a0,
                     (__m256i *)&local_4e0,(__m256i *)&local_560,(__m256i *)&local_520,
                     (__m256i *)&local_540,(__m256i *)&local_500,&local_580,bit);
  auVar2._4_4_ = iStack_6dc;
  auVar2._0_4_ = local_6e0;
  auVar2._8_4_ = iStack_6d8;
  auVar2._12_4_ = iStack_6d4;
  auVar2._16_4_ = iStack_6d0;
  auVar2._20_4_ = iStack_6cc;
  auVar2._24_4_ = iStack_6c8;
  auVar2._28_4_ = iStack_6c4;
  auVar12 = vpmulld_avx2((undefined1  [32])local_460,auVar2);
  auVar12 = vpaddd_avx2(auVar12,(undefined1  [32])local_5c0);
  local_460 = (__m256i)vpsrad_avx2(auVar12,local_690);
  local_3c0 = local_3e0._0_8_;
  uStack_3b8 = local_3e0._8_8_;
  uStack_3b0 = local_3e0._16_8_;
  uStack_3a8 = local_3e0._24_8_;
  local_3a0 = local_380._0_8_;
  uStack_398 = local_380._8_8_;
  uStack_390 = local_380._16_8_;
  uStack_388 = local_380._24_8_;
  local_440 = local_460;
  idct32_stage5_avx2(&local_460,(__m256i *)&local_660,(__m256i *)&local_600,(__m256i *)&local_640,
                     (__m256i *)&local_620,(__m256i *)&local_5a0,(__m256i *)&local_680,&local_580,
                     bit);
  local_400 = local_460[0];
  lStack_3f8 = local_460[1];
  lStack_3f0 = local_460[2];
  lStack_3e8 = local_460[3];
  local_420 = local_440[0];
  lStack_418 = local_440[1];
  lStack_410 = local_440[2];
  lStack_408 = local_440[3];
  idct32_stage6_avx2(&local_460,(__m256i *)&local_5e0,(__m256i *)&local_6e0,(__m256i *)&local_660,
                     (__m256i *)&local_600,(__m256i *)&local_640,(__m256i *)&local_5a0,
                     (__m256i *)&local_680,&local_580,rounding_00,bit_00);
  idct32_stage7_avx2(&local_460,(__m256i *)&local_5e0,(__m256i *)&local_6e0,(__m256i *)&local_5a0,
                     (__m256i *)&local_680,&local_580,bit);
  idct32_stage8_avx2(&local_460,(__m256i *)&local_5e0,(__m256i *)&local_6e0,(__m256i *)&local_5a0,
                     (__m256i *)&local_680,&local_580,bit);
  idct32_stage9_avx2(&local_460,local_6c0,do_cols,bd,out_shift,(__m256i *)&local_5a0,
                     (__m256i *)&local_680);
  return;
}

Assistant:

static void idct32_low8_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  // stage 1
  __m256i x[32];
  x[0] = input[0];
  x[4] = input[4];
  x[8] = input[2];
  x[12] = input[6];
  x[16] = input[1];
  x[20] = input[5];
  x[24] = input[3];
  x[28] = input[7];

  // stage 2
  btf_16_w16_0_avx2(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_w16_0_avx2(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_w16_0_avx2(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_w16_0_avx2(-cospi[58], cospi[6], x[24], x[23], x[24]);

  // stage 3
  btf_16_w16_0_avx2(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_w16_0_avx2(-cospi[52], cospi[12], x[12], x[11], x[12]);
  x[17] = x[16];
  x[18] = x[19];
  x[21] = x[20];
  x[22] = x[23];
  x[25] = x[24];
  x[26] = x[27];
  x[29] = x[28];
  x[30] = x[31];

  // stage 4
  btf_16_w16_0_avx2(cospi[56], cospi[8], x[4], x[4], x[7]);
  x[9] = x[8];
  x[10] = x[11];
  x[13] = x[12];
  x[14] = x[15];
  idct32_high16_stage4_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 5
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);
  x[5] = x[4];
  x[6] = x[7];
  idct32_high24_stage5_avx2(x, cospi, _r, INV_COS_BIT);
  // stage 6
  x[3] = x[0];
  x[2] = x[1];
  idct32_high28_stage6_avx2(x, cospi, _r, INV_COS_BIT);

  idct32_stage7_avx2(x, cospi, _r, INV_COS_BIT);
  idct32_stage8_avx2(x, cospi, _r, INV_COS_BIT);
  idct32_stage9_avx2(output, x);
}